

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O0

void Fra_ManFinalizeComb(Fra_Man_t *p)

{
  Aig_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Fra_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pManAig->vCos), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,local_1c);
    p_00 = p->pManFraig;
    pAVar2 = Fra_ObjChild0Fra(pAVar2,0);
    Aig_ObjCreateCo(p_00,pAVar2);
  }
  Aig_ManCleanMarkB(p->pManFraig);
  return;
}

Assistant:

void Fra_ManFinalizeComb( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // add the POs
    Aig_ManForEachCo( p->pManAig, pObj, i )
        Aig_ObjCreateCo( p->pManFraig, Fra_ObjChild0Fra(pObj,0) );
    // postprocess
    Aig_ManCleanMarkB( p->pManFraig );
}